

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O3

wostream * mjs::operator<<(wostream *os,regexp_flag f)

{
  wostream *pwVar1;
  regexp_flag in_EDX;
  undefined4 in_register_00000034;
  wstring local_30;
  
  regexp_flags_to_string_abi_cxx11_(&local_30,(mjs *)CONCAT44(in_register_00000034,f),in_EDX);
  pwVar1 = std::__ostream_insert<wchar_t,std::char_traits<wchar_t>>
                     (os,local_30._M_dataplus._M_p,local_30._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity * 4 + 4);
  }
  return pwVar1;
}

Assistant:

std::wostream& operator<<(std::wostream& os, regexp_flag f) {
    return os << regexp_flags_to_string(f);
}